

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  GLenum target;
  LoadStoreMachine *pLVar1;
  bool bVar2;
  TestLog **this_01;
  undefined8 uVar3;
  ivec4 *extraout_RDX;
  ivec4 *extraout_RDX_00;
  Vector<int,_4> *v;
  ivec4 *extraout_RDX_01;
  ivec4 *b;
  ulong uVar4;
  Vector<float,_4> *in_R8;
  Vector<float,_4> *expected_value_00;
  int i;
  long lVar5;
  bool bVar6;
  GLenum *pGVar7;
  GLuint local_a0;
  GLuint local_9c;
  GLuint textures [4];
  string local_88;
  LoadStoreMachine *local_60;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> b_data;
  ShaderImageLoadStoreBase aSStack_40 [16];
  
  if (*(int *)(this + 0x30) == 4) {
    GenStoreShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)&DAT_00000004,internalformat,(GLenum)write_value,in_R8)
    ;
    local_9c = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,&local_88,false);
    std::__cxx11::string::~string((string *)&local_88);
    GenLoadShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x30),internalformat,
               (GLenum)expected_value,in_R8);
    local_a0 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,&local_88,false);
  }
  else {
    local_a0 = 0;
    local_9c = 0;
    if (*(int *)(this + 0x30) != 0) goto LAB_00c62c4c;
    GenStoreShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)0x0,internalformat,(GLenum)write_value,in_R8);
    expected_value_00 = (Vector<float,_4> *)0x0;
    local_9c = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,local_88._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",false,false);
    std::__cxx11::string::~string((string *)&local_88);
    GenLoadShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x30),internalformat,
               (GLenum)expected_value,expected_value_00);
    local_a0 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,local_88._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",false,false);
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_00c62c4c:
  this_00 = (CallLogWrapper *)(this + 8);
  local_60 = this;
  glu::CallLogWrapper::glGenTextures(this_00,4,textures);
  pGVar7 = &DAT_017594f0;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    target = *pGVar7;
    glu::CallLogWrapper::glBindTexture(this_00,target,textures[lVar5]);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,100,1);
    pGVar7 = pGVar7 + 1;
  }
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[2],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\x01',0,0x88b9,internalformat);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&b_data,100,(allocator_type *)&local_88);
  pLVar1 = local_60;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*(GLuint *)(local_60 + 0x2c));
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x640,
             b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,local_9c);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(pLVar1 + 0x28));
  if (*(int *)(pLVar1 + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,100);
  }
  else if (*(int *)(pLVar1 + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[0],0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[1],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[2],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[3],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glUseProgram(this_00,local_a0);
  if (*(int *)(pLVar1 + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  else if (*(int *)(pLVar1 + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,100);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar3 = 0x640;
  this_01 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x640,1);
  bVar6 = true;
  b = extraout_RDX;
  for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
    local_88._M_dataplus._M_p = (char *)0x100000000;
    local_88._M_string_length = 0x100000000;
    bVar2 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this_01,(ivec4 *)&local_88,b,(GLenum)uVar3);
    b = extraout_RDX_00;
    if (!bVar2) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)aSStack_40,(Vector<int,_4> *)this_01);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_88,aSStack_40,v);
      glcts::anon_unknown_0::Output
                ("[%d] load/store operation check failed. (%s) \n",uVar4 & 0xffffffff,
                 local_88._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_88);
      bVar6 = false;
      b = extraout_RDX_01;
    }
    this_01 = this_01 + 2;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,local_9c);
  glu::CallLogWrapper::glDeleteProgram(this_00,local_a0);
  glu::CallLogWrapper::glDeleteTextures(this_00,4,textures);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>)
  ;
  return bVar6;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[]	 = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets	  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize		   = 100;
		GLuint		 program_store = 0;
		GLuint		 program_load  = 0;
		if (m_stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program_store	  = BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), src_fs);
			program_load	   = BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), src_fs);
		}
		else if (m_stage == 4)
		{ // CS
			program_store = CreateComputeProgram(GenStoreShader(m_stage, internalformat, write_value));
			program_load  = CreateComputeProgram(GenLoadShader(m_stage, internalformat, expected_value));
		}
		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program_store);
		glBindVertexArray(m_vao);
		if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		bool status = true;
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		glBindImageTexture(3, textures[0], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 3D
		glBindImageTexture(1, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // Cube
		glBindImageTexture(0, textures[3], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 2DArray

		glUseProgram(program_load);
		if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] load/store operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		return status;
	}